

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O2

bool __thiscall Json::Reader::decodeDouble(Reader *this,Token *token,Value *decoded)

{
  int iVar1;
  string *this_00;
  uint uVar2;
  double value;
  Char buffer [33];
  double local_d0;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  Value local_58;
  
  local_d0 = 0.0;
  uVar2 = (int)token->end_ - (int)token->start_;
  if ((int)uVar2 < 0) {
    std::__cxx11::string::string
              ((string *)&local_c8,"Unable to parse token length",(allocator *)&local_78);
    addError(this,&local_c8,token,(Location)0x0);
    this_00 = &local_c8;
  }
  else {
    if (uVar2 < 0x21) {
      memcpy(&local_c8,token->start_,(ulong)(uVar2 & 0x3f));
      *(undefined1 *)((long)&local_c8._M_dataplus._M_p + (ulong)(uVar2 & 0x3f)) = 0;
      iVar1 = __isoc99_sscanf(&local_c8,&DAT_0057193c,&local_d0);
    }
    else {
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8);
      iVar1 = __isoc99_sscanf(local_c8._M_dataplus._M_p,&DAT_0057193c,&local_d0);
      std::__cxx11::string::~string((string *)&local_c8);
    }
    if (iVar1 == 1) {
      Value::Value(&local_58,local_d0);
      Value::operator=(decoded,&local_58);
      Value::~Value(&local_58);
      return true;
    }
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,token->start_,token->end_);
    std::operator+(&local_78,"\'",&local_98);
    std::operator+(&local_c8,&local_78,"\' is not a number.");
    addError(this,&local_c8,token,(Location)0x0);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_78);
    this_00 = &local_98;
  }
  std::__cxx11::string::~string((string *)this_00);
  return false;
}

Assistant:

bool Reader::decodeDouble(Token& token, Value& decoded) {
  double value = 0;
  const int bufferSize = 32;
  int count;
  int length = int(token.end_ - token.start_);

  // Sanity check to avoid buffer overflow exploits.
  if (length < 0) {
    return addError("Unable to parse token length", token);
  }

  // Avoid using a string constant for the format control string given to
  // sscanf, as this can cause hard to debug crashes on OS X. See here for more
  // info:
  //
  //     http://developer.apple.com/library/mac/#DOCUMENTATION/DeveloperTools/gcc-4.0.1/gcc/Incompatibilities.html
  char format[] = "%lf";

  if (length <= bufferSize) {
    Char buffer[bufferSize + 1];
    memcpy(buffer, token.start_, length);
    buffer[length] = 0;
    count = sscanf(buffer, format, &value);
  } else {
    std::string buffer(token.start_, token.end_);
    count = sscanf(buffer.c_str(), format, &value);
  }

  if (count != 1)
    return addError("'" + std::string(token.start_, token.end_) +
                        "' is not a number.",
                    token);
  decoded = value;
  return true;
}